

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

void __thiscall QtMWidgets::RowsSeparator::paintEvent(RowsSeparator *this,QPaintEvent *param_1)

{
  ColorGroup CVar1;
  QPainter p;
  undefined1 local_20 [8];
  undefined8 local_18;
  int local_10;
  undefined4 local_c;
  
  QPainter::QPainter((QPainter *)local_20,(QPaintDevice *)&this->field_0x10);
  CVar1 = QWidget::palette();
  QPalette::brush(CVar1,Dark);
  QPainter::setPen((QColor *)local_20);
  local_10 = (*(int *)(*(long *)&this->field_0x20 + 0x1c) -
             *(int *)(*(long *)&this->field_0x20 + 0x14)) + 1;
  local_18._0_4_ = 0xb;
  local_18._4_4_ = 0;
  local_c = 0;
  QPainter::drawLines((QLine *)local_20,(int)&local_18);
  QPainter::~QPainter((QPainter *)local_20);
  return;
}

Assistant:

void paintEvent( QPaintEvent * ) override
	{
		QPainter p( this );

		p.setPen( palette().color( QPalette::Midlight ) );
		p.drawLine( 11, 0, width(), 0 );
	}